

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::EncodeSplitData
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this)

{
  size_type sVar1;
  reference pvVar2;
  uint uVar3;
  int iVar4;
  long in_RDI;
  int64_t unaff_retaddr;
  EncoderBuffer *in_stack_00000008;
  TopologySplitEventData *event_data_1;
  uint32_t i_1;
  TopologySplitEventData *event_data;
  uint32_t i;
  int last_source_symbol_id;
  uint32_t num_events;
  EncoderBuffer *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  uint local_24;
  uint local_14;
  uint32_t local_10;
  long lVar6;
  undefined1 encode_size;
  
  lVar6 = in_RDI;
  sVar1 = std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
          ::size((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  *)(in_RDI + 0xf8));
  uVar3 = (uint)sVar1;
  uVar5 = uVar3;
  PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
  EncodeVarint<unsigned_int>
            ((uint)in_RDI,
             (EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (uVar3 != 0) {
    local_10 = 0;
    for (local_14 = 0; encode_size = (undefined1)((ulong)lVar6 >> 0x38), local_14 < uVar3;
        local_14 = local_14 + 1) {
      pvVar2 = std::
               vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
               ::operator[]((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                             *)(in_RDI + 0xf8),(ulong)local_14);
      iVar4 = pvVar2->source_symbol_id - local_10;
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
      EncodeVarint<unsigned_int>
                ((uint)in_RDI,(EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffbc,iVar4));
      in_stack_ffffffffffffffbc = pvVar2->source_symbol_id - pvVar2->split_symbol_id;
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
      EncodeVarint<unsigned_int>
                ((uint)in_RDI,(EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffbc,iVar4));
      local_10 = pvVar2->source_symbol_id;
    }
    PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
    EncoderBuffer::StartBitEncoding(in_stack_00000008,unaff_retaddr,(bool)encode_size);
    for (local_24 = 0; local_24 < uVar3; local_24 = local_24 + 1) {
      std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
      operator[]((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  *)(in_RDI + 0xf8),(ulong)local_24);
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
      EncoderBuffer::EncodeLeastSignificantBits32
                ((EncoderBuffer *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                 (int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    }
    PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RDI + 8));
    EncoderBuffer::EndBitEncoding(in_stack_00000050);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeSplitData() {
  uint32_t num_events =
      static_cast<uint32_t>(topology_split_event_data_.size());
  EncodeVarint(num_events, encoder_->buffer());
  if (num_events > 0) {
    // Encode split symbols using delta and varint coding. Split edges are
    // encoded using direct bit coding.
    int last_source_symbol_id = 0;  // Used for delta coding.
    for (uint32_t i = 0; i < num_events; ++i) {
      const TopologySplitEventData &event_data = topology_split_event_data_[i];
      // Encode source symbol id as delta from the previous source symbol id.
      // Source symbol ids are always stored in increasing order so the delta is
      // going to be positive.
      EncodeVarint<uint32_t>(
          event_data.source_symbol_id - last_source_symbol_id,
          encoder_->buffer());
      // Encode split symbol id as delta from the current source symbol id.
      // Split symbol id is always smaller than source symbol id so the below
      // delta is going to be positive.
      EncodeVarint<uint32_t>(
          event_data.source_symbol_id - event_data.split_symbol_id,
          encoder_->buffer());
      last_source_symbol_id = event_data.source_symbol_id;
    }
    encoder_->buffer()->StartBitEncoding(num_events, false);
    for (uint32_t i = 0; i < num_events; ++i) {
      const TopologySplitEventData &event_data = topology_split_event_data_[i];
      encoder_->buffer()->EncodeLeastSignificantBits32(1,
                                                       event_data.source_edge);
    }
    encoder_->buffer()->EndBitEncoding();
  }
  return true;
}